

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_ptr.h
# Opt level: O3

second_type *
ctemplate::
find_ptr<ctemplate::small_map<std::map<unsigned_long,ctemplate::TemplateString,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,ctemplate::TemplateString>,ctemplate::UnsafeArena>>,4,std::equal_to<unsigned_long>,ctemplate::TemplateDictionary::map_arena_init>,unsigned_long>
          (small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
           *c,unsigned_long v)

{
  uint uVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  const_iterator cVar4;
  unsigned_long local_10;
  
  local_10 = v;
  cVar4 = small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
          ::find(c,&local_10);
  p_Var2 = (_Base_ptr)cVar4.array_iter_;
  uVar1 = c->size_;
  if (p_Var2 == (_Base_ptr)0x0) {
    p_Var3 = (_Base_ptr)((long)&c->field_2 + 0x10);
    if (-1 < (int)uVar1) {
      p_Var3 = (_Base_ptr)0x0;
    }
    if (-1 >= (int)uVar1 && cVar4.hash_iter_._M_node._M_node == p_Var3) {
      return (second_type *)0x0;
    }
  }
  else {
    p_Var3 = (_Base_ptr)((long)&c->field_2 + (ulong)uVar1 * 0x28);
    if ((int)uVar1 < 0) {
      p_Var3 = (_Base_ptr)0x0;
    }
    if (p_Var2 == p_Var3) {
      return (second_type *)0x0;
    }
  }
  p_Var3 = cVar4.hash_iter_._M_node._M_node + 1;
  if (p_Var2 != (_Base_ptr)0x0) {
    p_Var3 = p_Var2;
  }
  return (second_type *)&p_Var3->_M_parent;
}

Assistant:

const typename T::value_type::second_type* find_ptr(const T& c, U v)
{
  typename T::const_iterator i = c.find(v);
  return i == c.end() ? NULL : &i->second;
}